

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

_Bool pick_and_place_monster
                (chunk *c,loc_conflict grid,wchar_t depth,_Bool sleep,_Bool group_okay,
                uint8_t origin)

{
  _Bool _Var1;
  monster_race *race;
  
  race = get_mon_num(depth,c->depth);
  if (race == (monster_race *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = place_new_monster(c,grid,race,sleep,group_okay,(monster_group_info)0x0,origin);
  }
  return _Var1;
}

Assistant:

bool pick_and_place_monster(struct chunk *c, struct loc grid, int depth,
		bool sleep, bool group_okay, uint8_t origin)
{
	/* Pick a monster race, no specified group */
	struct monster_race *race = get_mon_num(depth, c->depth);
	struct monster_group_info info = { 0, 0 };

	if (race) {
		return place_new_monster(c, grid, race, sleep, group_okay, info,
								 origin);
	} else {
		return false;
	}
}